

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O3

QMatchData * __thiscall
QSortedModelEngine::filter
          (QMatchData *__return_storage_ptr__,QSortedModelEngine *this,QString *part,
          QModelIndex *parent,int param_3)

{
  QString part_00;
  QString part_01;
  QString part_02;
  QString part_03;
  int *piVar1;
  qsizetype qVar2;
  QArrayData *pQVar3;
  undefined8 uVar4;
  QArrayData *pQVar5;
  undefined8 uVar6;
  Data *pDVar7;
  uint uVar8;
  bool bVar9;
  char cVar10;
  SortOrder SVar11;
  int iVar12;
  long *plVar13;
  uint uVar14;
  uint uVar15;
  QCompletionEngine *pQVar16;
  CaseSensitivity CVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  long in_FS_OFFSET;
  undefined1 in_stack_fffffffffffffe48 [12];
  QCompletionEngine *pQVar23;
  uint local_18c;
  ulong local_188;
  QArrayData *local_160;
  QArrayData *local_150;
  char16_t *local_148;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_140;
  QArrayData *local_138;
  char16_t *local_130;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_128;
  QArrayData *local_120;
  char16_t *local_118;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_110;
  QArrayData *local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  QArrayData *local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined1 local_c8 [8];
  QArrayData *pQStack_c0;
  undefined8 uStack_b8;
  QArrayData *local_b0;
  char16_t *local_a8;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_a0;
  QMatchData local_98;
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  uint uStack_48;
  uint uStack_44;
  undefined4 uStack_40;
  undefined1 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar13 = (long *)QAbstractProxyModel::sourceModel();
  local_98.indices.v = false;
  local_98.indices._1_7_ = 0xaaaaaaaaaaaaaa;
  local_98.indices.vector.d.d = (Data *)0x0;
  local_98.indices.vector.d.ptr._0_4_ = 0;
  local_98.indices.vector.d.ptr._4_4_ = 0;
  local_98.indices.vector.d.size._0_4_ = 0;
  local_98.indices.vector.d.size._4_4_ = 0;
  local_98.indices.f = 0;
  local_98.indices.t = 0xffffffff;
  local_98.exactMatchIndex = -1;
  local_98.partial = false;
  local_98._45_3_ = 0xaaaaaa;
  bVar9 = QCompletionEngine::lookupCache(&this->super_QCompletionEngine,part,parent,&local_98);
  pDVar7 = local_98.indices.vector.d.d;
  if (bVar9) {
    (__return_storage_ptr__->indices).v = local_98.indices.v;
    piVar1 = (int *)CONCAT44(local_98.indices.vector.d.ptr._4_4_,local_98.indices.vector.d.ptr._0_4_
                            );
    local_98.indices.vector.d.d = (Data *)0x0;
    local_98.indices.vector.d.ptr._0_4_ = 0;
    local_98.indices.vector.d.ptr._4_4_ = 0;
    (__return_storage_ptr__->indices).vector.d.d = pDVar7;
    (__return_storage_ptr__->indices).vector.d.ptr = piVar1;
    qVar2 = CONCAT44(local_98.indices.vector.d.size._4_4_,(undefined4)local_98.indices.vector.d.size
                    );
    local_98.indices.vector.d.size._0_4_ = 0;
    local_98.indices.vector.d.size._4_4_ = 0;
    (__return_storage_ptr__->indices).vector.d.size = qVar2;
    (__return_storage_ptr__->indices).f = local_98.indices.f;
    (__return_storage_ptr__->indices).t = local_98.indices.t;
    __return_storage_ptr__->exactMatchIndex = local_98.exactMatchIndex;
    __return_storage_ptr__->partial = local_98.partial;
    goto LAB_00649ffc;
  }
  SVar11 = sortOrder(this,parent);
  bVar9 = QCompletionEngine::matchHint(&this->super_QCompletionEngine,part,parent,&local_98);
  if (bVar9) {
    if (local_98.indices.v == true) {
      if (CONCAT44(local_98.indices.vector.d.size._4_4_,(undefined4)local_98.indices.vector.d.size)
          == 0) {
LAB_00649ebe:
        (__return_storage_ptr__->indices).v = false;
        (__return_storage_ptr__->indices).vector.d.d = (Data *)0x0;
        (__return_storage_ptr__->indices).vector.d.ptr = (int *)0x0;
        *(undefined8 *)((long)&(__return_storage_ptr__->indices).vector.d.ptr + 4) = 0;
        *(undefined8 *)((long)&(__return_storage_ptr__->indices).vector.d.size + 4) = 0;
        *(undefined8 *)&(__return_storage_ptr__->indices).t = 0xffffffffffffffff;
        __return_storage_ptr__->partial = false;
        goto LAB_00649ffc;
      }
    }
    else if (local_98.indices.t < local_98.indices.f) goto LAB_00649ebe;
    if (&(local_98.indices.vector.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.indices.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           = ((local_98.indices.vector.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_160 = &(local_98.indices.vector.d.d)->super_QArrayData;
    uVar15 = local_98.indices.f;
    uVar21 = local_98.indices.t;
  }
  else {
    local_b0 = &((part->d).d)->super_QArrayData;
    local_a8 = (part->d).ptr;
    local_a0.ptr = (QAbstractItemModel *)(part->d).size;
    if (local_b0 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_b0->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_b0->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    part_00.d.ptr._4_4_ = SVar11;
    part_00.d._0_12_ = in_stack_fffffffffffffe48;
    part_00.d.size = (qsizetype)this;
    indexHint((QIndexMapper *)&local_68,this,part_00,(QModelIndex *)&local_b0,(SortOrder)parent);
    uVar21 = uStack_44;
    uVar15 = uStack_48;
    local_160 = (QArrayData *)local_68._8_8_;
    local_68._8_8_ = (QArrayData *)0x0;
    local_68._16_4_ = 0;
    local_68._20_4_ = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    if (local_b0 != (QArrayData *)0x0) {
      LOCK();
      (local_b0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_b0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_b0,2,0x10);
      }
    }
  }
  uVar19 = uVar21 + 1;
  uVar14 = uVar15 - 1;
  local_c8 = (undefined1  [8])0xffffffffffffffff;
  pQStack_c0 = (QArrayData *)0x0;
  uStack_b8 = 0;
  local_e8 = (QArrayData *)0x0;
  uStack_e0 = 0;
  local_d8 = 0;
  CVar17 = (CaseSensitivity)part;
  uVar18 = uVar14;
  uVar20 = uVar19;
  pQVar16 = &this->super_QCompletionEngine;
  if (1 < (int)(uVar19 - uVar14)) {
    do {
      uVar22 = (int)(uVar20 + uVar18) / 2;
      (**(code **)(*plVar13 + 0x60))
                (&local_68,plVar13,uVar22,((this->super_QCompletionEngine).c)->column);
      uStack_b8 = CONCAT44(local_68._20_4_,local_68._16_4_);
      local_c8._4_4_ = local_68._4_4_;
      local_c8._0_4_ = local_68._0_4_;
      pQStack_c0 = (QArrayData *)local_68._8_8_;
      (**(code **)(*plVar13 + 0x90))
                (&local_68,plVar13,local_c8,((this->super_QCompletionEngine).c)->role);
      ::QVariant::toString();
      uVar6 = uStack_e0;
      pQVar5 = local_e8;
      uVar4 = local_f8;
      pQVar3 = local_108;
      local_108 = local_e8;
      local_e8 = pQVar3;
      uStack_e0 = uStack_100;
      uStack_100 = uVar6;
      local_f8 = local_d8;
      local_d8 = uVar4;
      this = (QSortedModelEngine *)pQVar16;
      if (pQVar5 != (QArrayData *)0x0) {
        LOCK();
        (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar5,2,0x10);
          this = (QSortedModelEngine *)pQVar16;
        }
      }
      bVar9 = SVar11 == AscendingOrder;
      ::QVariant::~QVariant((QVariant *)&local_68);
      pQVar16 = &this->super_QCompletionEngine;
      iVar12 = QString::compare((QString *)&local_e8,CVar17);
      uVar8 = uVar22;
      if (iVar12 < 0 != bVar9) {
        uVar8 = uVar18;
        uVar20 = uVar22;
      }
      uVar18 = uVar8;
    } while (1 < (int)(uVar20 - uVar18));
  }
  if (SVar11 == AscendingOrder) {
    bVar9 = uVar18 == uVar21;
  }
  else {
    bVar9 = uVar20 == uVar15;
  }
  if (bVar9) {
    local_120 = &((part->d).d)->super_QArrayData;
    local_118 = (part->d).ptr;
    local_110.ptr = (QAbstractItemModel *)(part->d).size;
    if (local_120 != (QArrayData *)0x0) {
      LOCK();
      (local_120->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_120->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_68._0_4_ = local_68._0_4_ & 0xffffff00;
    local_68._8_8_ = (QArrayData *)0x0;
    local_68._16_4_ = 0;
    local_68._20_4_ = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    uStack_48 = 0;
    uStack_44 = 0xffffffff;
    uStack_40 = 0xffffffff;
    local_3c = 0;
    part_01.d.ptr._4_4_ = SVar11;
    part_01.d._0_12_ = in_stack_fffffffffffffe48;
    part_01.d.size = (qsizetype)pQVar16;
    QCompletionEngine::saveInCache(pQVar16,part_01,(QModelIndex *)&local_120,(QMatchData *)parent);
    if ((QArrayData *)local_68._8_8_ != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_68._8_8_ = *(int *)local_68._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_68._8_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_68._8_8_,4,0x10);
      }
    }
    if (local_120 != (QArrayData *)0x0) {
      LOCK();
      (local_120->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_120->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      iVar12 = (local_120->ref_)._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      pQVar3 = local_120;
joined_r0x00649f7e:
      if (iVar12 == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
LAB_00649f97:
    (__return_storage_ptr__->indices).v = false;
    (__return_storage_ptr__->indices).vector.d.d = (Data *)0x0;
    (__return_storage_ptr__->indices).vector.d.ptr = (int *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->indices).vector.d.ptr + 4) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->indices).vector.d.size + 4) = 0;
    *(undefined8 *)&(__return_storage_ptr__->indices).t = 0xffffffffffffffff;
    __return_storage_ptr__->partial = false;
  }
  else {
    uVar18 = uVar18 + 1;
    uVar20 = uVar20 - 1;
    uVar15 = uVar20;
    if (SVar11 == AscendingOrder) {
      uVar15 = uVar18;
    }
    pQVar23 = pQVar16;
    (**(code **)(*plVar13 + 0x60))(&local_68,plVar13,uVar15,pQVar16->c->column);
    uStack_b8 = CONCAT44(local_68._20_4_,local_68._16_4_);
    local_c8._4_4_ = local_68._4_4_;
    local_c8._0_4_ = local_68._0_4_;
    pQStack_c0 = (QArrayData *)local_68._8_8_;
    (**(code **)(*plVar13 + 0x90))(&local_68,plVar13,local_c8,pQVar16->c->role);
    ::QVariant::toString();
    uVar6 = uStack_e0;
    pQVar5 = local_e8;
    uVar4 = local_f8;
    pQVar3 = local_108;
    local_108 = local_e8;
    local_e8 = pQVar3;
    uStack_e0 = uStack_100;
    uStack_100 = uVar6;
    local_f8 = local_d8;
    local_d8 = uVar4;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
    ::QVariant::~QVariant((QVariant *)&local_68);
    pQVar16 = pQVar23;
    cVar10 = QString::startsWith((QString *)&local_e8,CVar17);
    if (cVar10 == '\0') {
      local_138 = &((part->d).d)->super_QArrayData;
      local_130 = (part->d).ptr;
      local_128.ptr = (QAbstractItemModel *)(part->d).size;
      if (local_138 != (QArrayData *)0x0) {
        LOCK();
        (local_138->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_138->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_68._0_4_ = local_68._0_4_ & 0xffffff00;
      local_68._8_8_ = (QArrayData *)0x0;
      local_68._16_4_ = 0;
      local_68._20_4_ = 0;
      uStack_50 = 0;
      uStack_4c = 0;
      uStack_48 = 0;
      uStack_44 = 0xffffffff;
      uStack_40 = 0xffffffff;
      local_3c = 0;
      part_02.d.ptr._4_4_ = SVar11;
      part_02.d._0_12_ = in_stack_fffffffffffffe48;
      part_02.d.size = (qsizetype)pQVar16;
      QCompletionEngine::saveInCache(pQVar23,part_02,(QModelIndex *)&local_138,(QMatchData *)parent)
      ;
      if ((QArrayData *)local_68._8_8_ != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_68._8_8_ = *(int *)local_68._8_8_ + -1;
        UNLOCK();
        if (*(int *)local_68._8_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_68._8_8_,4,0x10);
        }
      }
      if (local_138 != (QArrayData *)0x0) {
        LOCK();
        (local_138->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_138->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        iVar12 = (local_138->ref_)._q_value.super___atomic_base<int>._M_i;
        UNLOCK();
        pQVar3 = local_138;
        goto joined_r0x00649f7e;
      }
      goto LAB_00649f97;
    }
    iVar12 = QString::compare((QString *)&local_e8,CVar17);
    if (SVar11 == AscendingOrder) {
      local_188 = 0;
      local_18c = uVar18;
    }
    else {
      local_188 = (ulong)uVar20 << 0x20;
      local_18c = 0;
      uVar18 = uVar14;
      uVar19 = uVar20;
    }
    pQVar23 = pQVar16;
    if (1 < (int)(uVar19 - uVar18)) {
      do {
        uVar21 = (int)(uVar19 + uVar18) / 2;
        (**(code **)(*plVar13 + 0x60))(&local_68,plVar13,uVar21,pQVar16->c->column);
        uStack_b8 = CONCAT44(local_68._20_4_,local_68._16_4_);
        local_c8._4_4_ = local_68._4_4_;
        local_c8._0_4_ = local_68._0_4_;
        pQStack_c0 = (QArrayData *)local_68._8_8_;
        (**(code **)(*plVar13 + 0x90))(&local_68,plVar13,local_c8,pQVar16->c->role);
        ::QVariant::toString();
        uVar6 = uStack_e0;
        pQVar5 = local_e8;
        uVar4 = local_f8;
        pQVar3 = local_108;
        local_108 = local_e8;
        local_e8 = pQVar3;
        uStack_e0 = uStack_100;
        uStack_100 = uVar6;
        local_f8 = local_d8;
        local_d8 = uVar4;
        pQVar16 = pQVar23;
        if (pQVar5 != (QArrayData *)0x0) {
          LOCK();
          (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar5,2,0x10);
            pQVar16 = pQVar23;
          }
        }
        bVar9 = SVar11 == AscendingOrder;
        ::QVariant::~QVariant((QVariant *)&local_68);
        pQVar23 = pQVar16;
        cVar10 = QString::startsWith((QString *)&local_e8,CVar17);
        if ((bool)cVar10 != bVar9) {
          uVar19 = uVar21;
          uVar21 = uVar18;
        }
        uVar18 = uVar21;
      } while (1 < (int)(uVar19 - uVar18));
    }
    *(undefined1 **)&(__return_storage_ptr__->indices).f = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&__return_storage_ptr__->exactMatchIndex = &DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->indices).vector.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->indices).vector.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&__return_storage_ptr__->indices = &DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->indices).vector.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    if (SVar11 == AscendingOrder) {
      local_188 = CONCAT44(uVar19 - 1,local_18c);
    }
    else {
      local_188 = local_188 | uVar18 + 1;
    }
    (__return_storage_ptr__->indices).v = false;
    (__return_storage_ptr__->indices).vector.d.d = (Data *)0x0;
    (__return_storage_ptr__->indices).vector.d.ptr = (int *)0x0;
    (__return_storage_ptr__->indices).vector.d.size = 0;
    (__return_storage_ptr__->indices).f = (int)local_188;
    (__return_storage_ptr__->indices).t = (int)(local_188 >> 0x20);
    __return_storage_ptr__->exactMatchIndex = -(uint)(iVar12 != 0) | uVar15;
    __return_storage_ptr__->partial = false;
    local_150 = &((part->d).d)->super_QArrayData;
    local_148 = (part->d).ptr;
    local_140.ptr = (QAbstractItemModel *)(part->d).size;
    if (local_150 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_150->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_150->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    part_03.d.ptr._4_4_ = SVar11;
    part_03.d._0_12_ = in_stack_fffffffffffffe48;
    part_03.d.size = (qsizetype)pQVar23;
    QCompletionEngine::saveInCache(pQVar23,part_03,(QModelIndex *)&local_150,(QMatchData *)parent);
    if (local_150 != (QArrayData *)0x0) {
      LOCK();
      (local_150->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_150->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_150->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_150,2,0x10);
      }
    }
  }
  if (local_e8 != (QArrayData *)0x0) {
    LOCK();
    (local_e8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_e8,2,0x10);
    }
  }
  if (local_160 != (QArrayData *)0x0) {
    LOCK();
    (local_160->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_160->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_160->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_160,4,0x10);
    }
  }
LAB_00649ffc:
  if (&(local_98.indices.vector.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.indices.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.indices.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
         _M_i + -1;
    UNLOCK();
    if (((local_98.indices.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_98.indices.vector.d.d)->super_QArrayData,4,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QMatchData QSortedModelEngine::filter(const QString& part, const QModelIndex& parent, int)
{
    const QAbstractItemModel *model = c->proxy->sourceModel();

    QMatchData hint;
    if (lookupCache(part, parent, &hint))
        return hint;

    QIndexMapper indices;
    Qt::SortOrder order = sortOrder(parent);

    if (matchHint(part, parent, &hint)) {
        if (!hint.isValid())
            return QMatchData();
        indices = hint.indices;
    } else {
        indices = indexHint(part, parent, order);
    }

    // binary search the model within 'indices' for 'part' under 'parent'
    int high = indices.to() + 1;
    int low = indices.from() - 1;
    int probe;
    QModelIndex probeIndex;
    QString probeData;

    while (high - low > 1)
    {
        probe = (high + low) / 2;
        probeIndex = model->index(probe, c->column, parent);
        probeData = model->data(probeIndex, c->role).toString();
        const int cmp = QString::compare(probeData, part, c->cs);
        if ((order == Qt::AscendingOrder && cmp >= 0)
            || (order == Qt::DescendingOrder && cmp < 0)) {
            high = probe;
        } else {
            low = probe;
        }
    }

    if ((order == Qt::AscendingOrder && low == indices.to())
        || (order == Qt::DescendingOrder && high == indices.from())) { // not found
        saveInCache(part, parent, QMatchData());
        return QMatchData();
    }

    probeIndex = model->index(order == Qt::AscendingOrder ? low+1 : high-1, c->column, parent);
    probeData = model->data(probeIndex, c->role).toString();
    if (!probeData.startsWith(part, c->cs)) {
        saveInCache(part, parent, QMatchData());
        return QMatchData();
    }

    const bool exactMatch = QString::compare(probeData, part, c->cs) == 0;
    int emi =  exactMatch ? (order == Qt::AscendingOrder ? low+1 : high-1) : -1;

    int from = 0;
    int to = 0;
    if (order == Qt::AscendingOrder) {
        from = low + 1;
        high = indices.to() + 1;
        low = from;
    } else {
        to = high - 1;
        low = indices.from() - 1;
        high = to;
    }

    while (high - low > 1)
    {
        probe = (high + low) / 2;
        probeIndex = model->index(probe, c->column, parent);
        probeData = model->data(probeIndex, c->role).toString();
        const bool startsWith = probeData.startsWith(part, c->cs);
        if ((order == Qt::AscendingOrder && startsWith)
            || (order == Qt::DescendingOrder && !startsWith)) {
            low = probe;
        } else {
            high = probe;
        }
    }

    QMatchData m(order == Qt::AscendingOrder ? QIndexMapper(from, high - 1) : QIndexMapper(low+1, to), emi, false);
    saveInCache(part, parent, m);
    return m;
}